

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void handle_2misc_reciprocal
               (DisasContext_conflict1 *s,int opcode,_Bool is_scalar,_Bool is_u,_Bool is_q,int size,
               int rn,int rd)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_ptr arg2;
  TCGv_i64 arg;
  TCGv_i64 arg_00;
  TCGv_i32 arg_01;
  TCGv_i32 arg_02;
  int iVar1;
  int local_68;
  int local_64;
  int maxpasses;
  int pass_1;
  TCGv_i32 tcg_res_1;
  TCGv_i32 tcg_op_1;
  int pass;
  TCGv_i64 tcg_res;
  TCGv_i64 tcg_op;
  TCGv_ptr fpst;
  _Bool is_double;
  TCGContext_conflict1 *tcg_ctx;
  int size_local;
  _Bool is_q_local;
  _Bool is_u_local;
  _Bool is_scalar_local;
  int opcode_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  arg2 = get_fpstatus_ptr_aarch64(tcg_ctx_00,false);
  if (size == 3) {
    arg = tcg_temp_new_i64(tcg_ctx_00);
    arg_00 = tcg_temp_new_i64(tcg_ctx_00);
    tcg_op_1._4_4_ = 0;
    while( true ) {
      iVar1 = 2;
      if (is_scalar) {
        iVar1 = 1;
      }
      if (iVar1 <= tcg_op_1._4_4_) break;
      read_vec_element(s,arg,rn,tcg_op_1._4_4_,MO_64);
      if (opcode == 0x3d) {
        gen_helper_recpe_f64(tcg_ctx_00,arg_00,arg,arg2);
      }
      else if (opcode == 0x3f) {
        gen_helper_frecpx_f64(tcg_ctx_00,arg_00,arg,arg2);
      }
      else {
        if (opcode != 0x7d) {
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                     ,0x26df,(char *)0x0);
        }
        gen_helper_rsqrte_f64(tcg_ctx_00,arg_00,arg,arg2);
      }
      write_vec_element(s,arg_00,rd,tcg_op_1._4_4_,MO_64);
      tcg_op_1._4_4_ = tcg_op_1._4_4_ + 1;
    }
    tcg_temp_free_i64(tcg_ctx_00,arg_00);
    tcg_temp_free_i64(tcg_ctx_00,arg);
    clear_vec_high(s,(_Bool)((is_scalar ^ 0xffU) & 1),rd);
  }
  else {
    arg_01 = tcg_temp_new_i32(tcg_ctx_00);
    arg_02 = tcg_temp_new_i32(tcg_ctx_00);
    if (is_scalar) {
      local_68 = 1;
    }
    else {
      local_68 = 2;
      if (is_q) {
        local_68 = 4;
      }
    }
    for (local_64 = 0; local_64 < local_68; local_64 = local_64 + 1) {
      read_vec_element_i32(s,arg_01,rn,local_64,MO_32);
      if (opcode == 0x3c) {
        gen_helper_recpe_u32(tcg_ctx_00,arg_02,arg_01,arg2);
      }
      else if (opcode == 0x3d) {
        gen_helper_recpe_f32(tcg_ctx_00,arg_02,arg_01,arg2);
      }
      else if (opcode == 0x3f) {
        gen_helper_frecpx_f32(tcg_ctx_00,arg_02,arg_01,arg2);
      }
      else {
        if (opcode != 0x7d) {
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                     ,0x2702,(char *)0x0);
        }
        gen_helper_rsqrte_f32(tcg_ctx_00,arg_02,arg_01,arg2);
      }
      if (is_scalar) {
        write_fp_sreg(s,rd,arg_02);
      }
      else {
        write_vec_element_i32(s,arg_02,rd,local_64,MO_32);
      }
    }
    tcg_temp_free_i32(tcg_ctx_00,arg_02);
    tcg_temp_free_i32(tcg_ctx_00,arg_01);
    if (!is_scalar) {
      clear_vec_high(s,is_q,rd);
    }
  }
  tcg_temp_free_ptr(tcg_ctx_00,arg2);
  return;
}

Assistant:

static void handle_2misc_reciprocal(DisasContext *s, int opcode,
                                    bool is_scalar, bool is_u, bool is_q,
                                    int size, int rn, int rd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    bool is_double = (size == 3);
    TCGv_ptr fpst = get_fpstatus_ptr(tcg_ctx, false);

    if (is_double) {
        TCGv_i64 tcg_op = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 tcg_res = tcg_temp_new_i64(tcg_ctx);
        int pass;

        for (pass = 0; pass < (is_scalar ? 1 : 2); pass++) {
            read_vec_element(s, tcg_op, rn, pass, MO_64);
            switch (opcode) {
            case 0x3d: /* FRECPE */
                gen_helper_recpe_f64(tcg_ctx, tcg_res, tcg_op, fpst);
                break;
            case 0x3f: /* FRECPX */
                gen_helper_frecpx_f64(tcg_ctx, tcg_res, tcg_op, fpst);
                break;
            case 0x7d: /* FRSQRTE */
                gen_helper_rsqrte_f64(tcg_ctx, tcg_res, tcg_op, fpst);
                break;
            default:
                g_assert_not_reached();
            }
            write_vec_element(s, tcg_res, rd, pass, MO_64);
        }
        tcg_temp_free_i64(tcg_ctx, tcg_res);
        tcg_temp_free_i64(tcg_ctx, tcg_op);
        clear_vec_high(s, !is_scalar, rd);
    } else {
        TCGv_i32 tcg_op = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 tcg_res = tcg_temp_new_i32(tcg_ctx);
        int pass, maxpasses;

        if (is_scalar) {
            maxpasses = 1;
        } else {
            maxpasses = is_q ? 4 : 2;
        }

        for (pass = 0; pass < maxpasses; pass++) {
            read_vec_element_i32(s, tcg_op, rn, pass, MO_32);

            switch (opcode) {
            case 0x3c: /* URECPE */
                gen_helper_recpe_u32(tcg_ctx, tcg_res, tcg_op, fpst);
                break;
            case 0x3d: /* FRECPE */
                gen_helper_recpe_f32(tcg_ctx, tcg_res, tcg_op, fpst);
                break;
            case 0x3f: /* FRECPX */
                gen_helper_frecpx_f32(tcg_ctx, tcg_res, tcg_op, fpst);
                break;
            case 0x7d: /* FRSQRTE */
                gen_helper_rsqrte_f32(tcg_ctx, tcg_res, tcg_op, fpst);
                break;
            default:
                g_assert_not_reached();
            }

            if (is_scalar) {
                write_fp_sreg(s, rd, tcg_res);
            } else {
                write_vec_element_i32(s, tcg_res, rd, pass, MO_32);
            }
        }
        tcg_temp_free_i32(tcg_ctx, tcg_res);
        tcg_temp_free_i32(tcg_ctx, tcg_op);
        if (!is_scalar) {
            clear_vec_high(s, is_q, rd);
        }
    }
    tcg_temp_free_ptr(tcg_ctx, fpst);
}